

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::UniformStructTests::init()::Eval_loop_nested_struct_array::eval(deqp::ShaderEvalContext__
               (ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float local_30 [6];
  int local_18 [6];
  
  local_30[4] = (c->constCoords).m_data[1];
  local_30[5] = (c->constCoords).m_data[2];
  local_30[3] = (c->constCoords).m_data[0];
  local_30[0] = local_30[4];
  local_30[1] = local_30[5];
  local_30[2] = (c->constCoords).m_data[3];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_30[lVar1 + 3] + local_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = res.m_data[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = res.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }